

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Document::ReadGlobalSettings(Document *this)

{
  Scope *this_00;
  __shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Element *element;
  pointer pFVar2;
  allocator local_71;
  string local_70;
  shared_ptr<const_Assimp::FBX::PropertyTable> props;
  __shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  this_00 = (this->parser->root)._M_t.
            super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>._M_t
            .super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>.
            super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl;
  std::__cxx11::string::string((string *)&local_70,"GlobalSettings",(allocator *)&props);
  element = Scope::operator[](this_00,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if ((element == (Element *)0x0) ||
     ((element->compound)._M_t.
      super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>._M_t.
      super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>.
      super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl == (Scope *)0x0)) {
    std::__cxx11::string::string
              ((string *)&local_70,"no GlobalSettings dictionary found",(allocator *)&props);
    Util::DOMWarning(&local_70,(Element *)0x0);
    std::__cxx11::string::~string((string *)&local_70);
    pFVar2 = (pointer)operator_new(0x18);
    std::make_shared<Assimp::FBX::PropertyTable_const>();
    std::__shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2> *)pFVar2,
               &local_40);
    pFVar2->doc = this;
    std::
    __uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
    ::reset((__uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
             *)&this->globals,pFVar2);
    p_Var1 = &local_40;
  }
  else {
    std::__cxx11::string::string((string *)&local_70,"",&local_71);
    Util::GetPropertyTable
              ((Util *)&props,this,&local_70,element,
               (element->compound)._M_t.
               super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>.
               _M_t.
               super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>
               .super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl,true);
    std::__cxx11::string::~string((string *)&local_70);
    if (props.super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_70,"GlobalSettings dictionary contains no property table",
                 &local_71);
      Util::DOMError(&local_70,(Element *)0x0);
    }
    pFVar2 = (pointer)operator_new(0x18);
    std::__shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,
               &props.
                super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2> *)pFVar2,
               &local_30);
    pFVar2->doc = this;
    std::
    __uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
    ::reset((__uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
             *)&this->globals,pFVar2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    p_Var1 = &props.super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
  return;
}

Assistant:

void Document::ReadGlobalSettings()
{
    const Scope& sc = parser.GetRootScope();
    const Element* const ehead = sc["GlobalSettings"];
    if ( nullptr == ehead || !ehead->Compound() ) {
        DOMWarning( "no GlobalSettings dictionary found" );
        globals.reset(new FileGlobalSettings(*this, std::make_shared<const PropertyTable>()));
        return;
    }

    std::shared_ptr<const PropertyTable> props = GetPropertyTable( *this, "", *ehead, *ehead->Compound(), true );

    //double v = PropertyGet<float>( *props.get(), std::string("UnitScaleFactor"), 1.0 );

    if(!props) {
        DOMError("GlobalSettings dictionary contains no property table");
    }

    globals.reset(new FileGlobalSettings(*this, props));
}